

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O0

type jsoncons::
     json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<std::shared_ptr<(anonymous_namespace)::ns::Employee>,std::allocator<std::shared_ptr<(anonymous_namespace)::ns::Employee>>>,void>
     ::
     to_json<std::vector<std::shared_ptr<(anonymous_namespace)::ns::Employee>,std::allocator<std::shared_ptr<(anonymous_namespace)::ns::Employee>>>>
               (vector<std::shared_ptr<(anonymous_namespace)::ns::Employee>,_std::allocator<std::shared_ptr<(anonymous_namespace)::ns::Employee>_>_>
                *val)

{
  bool bVar1;
  const_iterator __last;
  const_iterator __lhs;
  __normal_iterator<const_std::shared_ptr<(anonymous_namespace)::ns::Employee>_*,_std::vector<std::shared_ptr<(anonymous_namespace)::ns::Employee>,_std::allocator<std::shared_ptr<(anonymous_namespace)::ns::Employee>_>_>_>
  *__rhs;
  undefined8 extraout_RDX;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  type tVar2;
  const_iterator it;
  size_t size;
  const_iterator last;
  const_iterator first;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j;
  vector<std::shared_ptr<(anonymous_namespace)::ns::Employee>,_std::allocator<std::shared_ptr<(anonymous_namespace)::ns::Employee>_>_>
  *in_stack_ffffffffffffff78;
  __normal_iterator<const_std::shared_ptr<(anonymous_namespace)::ns::Employee>_*,_std::vector<std::shared_ptr<(anonymous_namespace)::ns::Employee>,_std::allocator<std::shared_ptr<(anonymous_namespace)::ns::Employee>_>_>_>
  __first;
  __normal_iterator<const_std::shared_ptr<(anonymous_namespace)::ns::Employee>_*,_std::vector<std::shared_ptr<(anonymous_namespace)::ns::Employee>,_std::allocator<std::shared_ptr<(anonymous_namespace)::ns::Employee>_>_>_>
  local_58;
  shared_ptr<(anonymous_namespace)::ns::Employee> *local_50;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_48;
  __normal_iterator<const_std::shared_ptr<(anonymous_namespace)::ns::Employee>_*,_std::vector<std::shared_ptr<(anonymous_namespace)::ns::Employee>,_std::allocator<std::shared_ptr<(anonymous_namespace)::ns::Employee>_>_>_>
  *local_40;
  const_iterator val_00;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar3;
  allocator<char> local_13 [2];
  undefined1 local_11;
  
  local_11 = 0;
  __first._M_current = (shared_ptr<(anonymous_namespace)::ns::Employee> *)in_RDI;
  std::allocator<char>::allocator();
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json(in_RDI,local_13);
  std::allocator<char>::~allocator(local_13);
  __last = std::
           begin<std::vector<std::shared_ptr<(anonymous_namespace)::ns::Employee>,std::allocator<std::shared_ptr<(anonymous_namespace)::ns::Employee>>>>
                     (in_stack_ffffffffffffff78);
  local_48 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)__last;
  __lhs = std::
          end<std::vector<std::shared_ptr<(anonymous_namespace)::ns::Employee>,std::allocator<std::shared_ptr<(anonymous_namespace)::ns::Employee>>>>
                    (in_stack_ffffffffffffff78);
  local_50 = (shared_ptr<(anonymous_namespace)::ns::Employee> *)__lhs;
  val_00 = __lhs;
  pbVar3 = local_48;
  __rhs = (__normal_iterator<const_std::shared_ptr<(anonymous_namespace)::ns::Employee>_*,_std::vector<std::shared_ptr<(anonymous_namespace)::ns::Employee>,_std::allocator<std::shared_ptr<(anonymous_namespace)::ns::Employee>_>_>_>
           *)std::
             distance<__gnu_cxx::__normal_iterator<std::shared_ptr<(anonymous_namespace)::ns::Employee>const*,std::vector<std::shared_ptr<(anonymous_namespace)::ns::Employee>,std::allocator<std::shared_ptr<(anonymous_namespace)::ns::Employee>>>>>
                       (__first,(__normal_iterator<const_std::shared_ptr<(anonymous_namespace)::ns::Employee>_*,_std::vector<std::shared_ptr<(anonymous_namespace)::ns::Employee>,_std::allocator<std::shared_ptr<(anonymous_namespace)::ns::Employee>_>_>_>
                                 )__last._M_current);
  local_40 = __rhs;
  local_58._M_current = (shared_ptr<(anonymous_namespace)::ns::Employee> *)pbVar3;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::reserve
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)__first._M_current,
             (size_t)__last._M_current);
  pbVar3 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_58._M_current;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::shared_ptr<(anonymous_namespace)::ns::Employee>_*,_std::vector<std::shared_ptr<(anonymous_namespace)::ns::Employee>,_std::allocator<std::shared_ptr<(anonymous_namespace)::ns::Employee>_>_>_>
                             *)__lhs._M_current,__rhs), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<(anonymous_namespace)::ns::Employee>_*,_std::vector<std::shared_ptr<(anonymous_namespace)::ns::Employee>,_std::allocator<std::shared_ptr<(anonymous_namespace)::ns::Employee>_>_>_>
    ::operator*(&local_58);
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
    push_back<std::shared_ptr<(anonymous_namespace)::ns::Employee>const&>(pbVar3,val_00._M_current);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<(anonymous_namespace)::ns::Employee>_*,_std::vector<std::shared_ptr<(anonymous_namespace)::ns::Employee>,_std::allocator<std::shared_ptr<(anonymous_namespace)::ns::Employee>_>_>_>
    ::operator++(&local_58);
  }
  tVar2.field_0.int64_.val_ = extraout_RDX;
  tVar2.field_0._0_8_ = __first._M_current;
  return (type)tVar2.field_0;
}

Assistant:

static typename std::enable_if<!ext_traits::is_std_byte<typename Container::value_type>::value,Json>::type
        to_json(const T& val)
        {
            Json j(json_array_arg);
            auto first = std::begin(val);
            auto last = std::end(val);
            std::size_t size = std::distance(first,last);
            j.reserve(size);
            for (auto it = first; it != last; ++it)
            {
                j.push_back(*it);
            }
            return j;
        }